

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IArrayBox.cpp
# Opt level: O0

void __thiscall amrex::IFABio::write_header(IFABio *this,ostream *os,IArrayBox *fab,int nvar)

{
  ostream *poVar1;
  int in_ECX;
  BaseFab<int> *in_RDX;
  ostream *in_RSI;
  Box *unaff_retaddr;
  ostream *in_stack_00000008;
  IntDescriptor *in_stack_00000098;
  ostream *in_stack_000000a0;
  
  std::operator<<(in_RSI,"IFAB ");
  FPC::NativeIntDescriptor();
  amrex::operator<<(in_stack_000000a0,in_stack_00000098);
  BaseFab<int>::box(in_RDX);
  poVar1 = amrex::operator<<(in_stack_00000008,unaff_retaddr);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ECX);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void
IFABio::write_header (std::ostream& os, const IArrayBox& fab, int nvar) const
{
    AMREX_ASSERT(nvar <= fab.nComp());
    os <<"IFAB " << FPC::NativeIntDescriptor();
    os << fab.box() << ' ' << nvar << '\n';
}